

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::DefaultsTest::iterate(DefaultsTest *this)

{
  PFNGLNAMEDBUFFERDATA p_Var1;
  PFNGLGETNAMEDBUFFERPARAMETERI64V p_Var2;
  PFNGLGETNAMEDBUFFERPARAMETERIV p_Var3;
  PFNGLGETNAMEDBUFFERPOINTERV p_Var4;
  GLchar *pGVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ContextType ctxType;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 *puVar10;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar11;
  GLuint buffer;
  GLint data;
  GLuint local_44;
  undefined1 *local_40;
  long local_38;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar9);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar8 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar7) || (bVar8)) {
    local_44 = 0;
    p_Var1 = *(PFNGLNAMEDBUFFERDATA *)(lVar11 + 0xec0);
    this->m_pNamedBufferData = p_Var1;
    p_Var2 = *(PFNGLGETNAMEDBUFFERPARAMETERI64V *)(lVar11 + 0x8f0);
    this->m_pGetNamedBufferParameteri64v = p_Var2;
    p_Var3 = *(PFNGLGETNAMEDBUFFERPARAMETERIV *)(lVar11 + 0x8f8);
    this->m_pGetNamedBufferParameteriv = p_Var3;
    p_Var4 = *(PFNGLGETNAMEDBUFFERPOINTERV *)(lVar11 + 0x900);
    this->m_pGetNamedBufferPointerv = p_Var4;
    local_38 = lVar11;
    if ((p_Var1 == (PFNGLNAMEDBUFFERDATA)0x0) ||
       (((p_Var2 == (PFNGLGETNAMEDBUFFERPARAMETERI64V)0x0 ||
         (p_Var3 == (PFNGLGETNAMEDBUFFERPARAMETERIV)0x0)) ||
        (p_Var4 == (PFNGLGETNAMEDBUFFERPOINTERV)0x0)))) {
      puVar10 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar10 = 0;
      __cxa_throw(puVar10,&int::typeinfo,0);
    }
    (**(code **)(lVar11 + 0x3b8))(1,&local_44);
    err = (**(code **)(lVar11 + 0x800))();
    glu::checkError(err,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x8fb);
    bVar6 = 1;
    lVar11 = 0x10;
    do {
      local_40 = (undefined1 *)CONCAT44(local_40._4_4_,0xffffffff);
      (*this->m_pGetNamedBufferParameteriv)
                (local_44,*(GLenum *)((long)&PTR_deinit_0212abf0 + lVar11),(GLint *)&local_40);
      pGVar5 = *(GLchar **)((long)&PTR_iterate_0212abf8 + lVar11);
      bVar7 = CheckParameterError(this,pGVar5,"glGetNamedBufferParameteriv");
      bVar8 = CheckValue<int>(this,(int)local_40,
                              *(int *)((long)&iterate::test_values[0].pname + lVar11),pGVar5,
                              "glGetNamedBufferParameteriv");
      bVar6 = bVar6 & (bVar7 && bVar8);
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0xe8);
    lVar11 = 0x10;
    do {
      local_40 = &DAT_ffffffffffffffff;
      (*this->m_pGetNamedBufferParameteri64v)
                (local_44,*(GLenum *)((long)&PTR_deinit_0212abf0 + lVar11),(GLint64 *)&local_40);
      pGVar5 = *(GLchar **)((long)&PTR_iterate_0212abf8 + lVar11);
      bVar7 = CheckParameterError(this,pGVar5,"glGetNamedBufferParameteri64v");
      bVar8 = CheckValue<long>(this,(long)local_40,
                               (long)*(int *)((long)&iterate::test_values[0].pname + lVar11),pGVar5,
                               "glGetNamedBufferParameteri64v");
      bVar6 = bVar6 & (bVar7 && bVar8);
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0xe8);
    local_40 = &DAT_00000001;
    (*this->m_pGetNamedBufferPointerv)(local_44,0x88bd,&local_40);
    bVar7 = CheckParameterError(this,"GL_BUFFER_MAP_POINTER","glGetNamedBufferPointer");
    bVar8 = CheckValue<void*>(this,local_40,(void *)0x0,"GL_BUFFER_MAP_POINTER",
                              "glGetNamedBufferParameteriv");
    lVar11 = local_38;
    if (local_44 != 0) {
      (**(code **)(local_38 + 0x438))(1);
      local_44 = 0;
    }
    do {
      iVar9 = (**(code **)(lVar11 + 0x800))();
    } while (iVar9 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if ((bool)(bVar6 & (bVar7 && bVar8))) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DefaultsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	glw::GLuint buffer = 0;

	m_pNamedBufferData			   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pGetNamedBufferParameteri64v = (PFNGLGETNAMEDBUFFERPARAMETERI64V)gl.getNamedBufferParameteri64v;
	m_pGetNamedBufferParameteriv   = (PFNGLGETNAMEDBUFFERPARAMETERIV)gl.getNamedBufferParameteriv;
	m_pGetNamedBufferPointerv	  = (PFNGLGETNAMEDBUFFERPOINTERV)gl.getNamedBufferPointerv;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pGetNamedBufferParameteri64v) ||
			(DE_NULL == m_pGetNamedBufferParameteriv) || (DE_NULL == m_pGetNamedBufferPointerv))
		{
			throw 0;
		}

		/* Buffer creation. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		/* Test data for glGetNamedBufferParameteri*v. */
		static const struct
		{
			glw::GLenum		   pname;
			const glw::GLchar* pname_string;
			glw::GLint		   expected_data;
		} test_values[] = { { GL_BUFFER_SIZE, "GL_BUFFER_SIZE", 0 },
							{ GL_BUFFER_USAGE, "GL_BUFFER_USAGE", GL_STATIC_DRAW },
							{ GL_BUFFER_ACCESS, "GL_BUFFER_ACCESS", GL_READ_WRITE },
							{ GL_BUFFER_ACCESS_FLAGS, "GL_BUFFER_ACCESS_FLAGS", 0 },
							{ GL_BUFFER_IMMUTABLE_STORAGE, "GL_BUFFER_IMMUTABLE_STORAGE", GL_FALSE },
							{ GL_BUFFER_MAPPED, "GL_BUFFER_MAPPED", GL_FALSE },
							{ GL_BUFFER_MAP_OFFSET, "GL_BUFFER_MAP_OFFSET", 0 },
							{ GL_BUFFER_MAP_LENGTH, "GL_BUFFER_MAP_LENGTH", 0 },
							{ GL_BUFFER_STORAGE_FLAGS, "GL_BUFFER_STORAGE_FLAGS", 0 } };

		static const glw::GLuint test_dictionary_count = sizeof(test_values) / sizeof(test_values[0]);

		/* Test glGetNamedBufferParameteriv. */
		for (glw::GLuint i = 0; i < test_dictionary_count; ++i)
		{
			glw::GLint data = -1;

			m_pGetNamedBufferParameteriv(buffer, test_values[i].pname, &data);

			is_ok &= CheckParameterError(test_values[i].pname_string, "glGetNamedBufferParameteriv");

			is_ok &= CheckValue<glw::GLint>(data, test_values[i].expected_data, test_values[i].pname_string,
											"glGetNamedBufferParameteriv");
		}

		/* Test glGetNamedBufferParameteri64v. */
		for (glw::GLuint i = 0; i < test_dictionary_count; ++i)
		{
			glw::GLint64 data = -1;

			m_pGetNamedBufferParameteri64v(buffer, test_values[i].pname, &data);

			is_ok &= CheckParameterError(test_values[i].pname_string, "glGetNamedBufferParameteri64v");

			is_ok &= CheckValue<glw::GLint64>(data, (glw::GLint64)test_values[i].expected_data,
											  test_values[i].pname_string, "glGetNamedBufferParameteri64v");
		}

		/* Test glGetNamedBufferPointerv. */
		{
			glw::GLvoid* data = (glw::GLvoid*)1;

			m_pGetNamedBufferPointerv(buffer, GL_BUFFER_MAP_POINTER, &data);

			is_ok &= CheckParameterError("GL_BUFFER_MAP_POINTER", "glGetNamedBufferPointer");

			is_ok &= CheckValue<glw::GLvoid*>(data, (glw::GLvoid*)DE_NULL, "GL_BUFFER_MAP_POINTER",
											  "glGetNamedBufferParameteriv");
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}